

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O2

void __thiscall
cfd::js::api::json::ParseDescriptorResponse::ParseDescriptorResponse(ParseDescriptorResponse *this)

{
  _Rb_tree_header *p_Var1;
  allocator local_4e;
  allocator local_4d;
  allocator local_4c;
  allocator local_4b;
  allocator local_4a;
  allocator local_49;
  string *local_48;
  string *local_40;
  string *local_38;
  
  (this->super_JsonClassBase<cfd::js::api::json::ParseDescriptorResponse>)._vptr_JsonClassBase =
       (_func_int **)&PTR__ParseDescriptorResponse_00b37eb0;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string((string *)&this->type_,"",&local_49);
  local_38 = &this->type_;
  std::__cxx11::string::string((string *)&this->address_,"",&local_4a);
  local_40 = &this->address_;
  std::__cxx11::string::string((string *)&this->locking_script_,"",&local_4b);
  local_48 = &this->locking_script_;
  std::__cxx11::string::string((string *)&this->hash_type_,"",&local_4c);
  std::__cxx11::string::string((string *)&this->redeem_script_,"",&local_4d);
  this->include_multisig_ = false;
  std::__cxx11::string::string((string *)&this->tree_string_,"",&local_4e);
  (this->keys_).super_JsonVector<cfd::js::api::json::DescriptorKeyJson>.
  super_vector<cfd::js::api::json::DescriptorKeyJson,_std::allocator<cfd::js::api::json::DescriptorKeyJson>_>
  .
  super__Vector_base<cfd::js::api::json::DescriptorKeyJson,_std::allocator<cfd::js::api::json::DescriptorKeyJson>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->keys_).super_JsonVector<cfd::js::api::json::DescriptorKeyJson>.
  super_vector<cfd::js::api::json::DescriptorKeyJson,_std::allocator<cfd::js::api::json::DescriptorKeyJson>_>
  .
  super__Vector_base<cfd::js::api::json::DescriptorKeyJson,_std::allocator<cfd::js::api::json::DescriptorKeyJson>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->keys_).super_JsonVector<cfd::js::api::json::DescriptorKeyJson>.
  super_vector<cfd::js::api::json::DescriptorKeyJson,_std::allocator<cfd::js::api::json::DescriptorKeyJson>_>
  .
  super__Vector_base<cfd::js::api::json::DescriptorKeyJson,_std::allocator<cfd::js::api::json::DescriptorKeyJson>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->keys_).super_JsonVector<cfd::js::api::json::DescriptorKeyJson>._vptr_JsonVector =
       (_func_int **)&PTR__JsonVector_00b37f48;
  (this->scripts_).super_JsonVector<cfd::js::api::json::DescriptorScriptJson>.
  super_vector<cfd::js::api::json::DescriptorScriptJson,_std::allocator<cfd::js::api::json::DescriptorScriptJson>_>
  .
  super__Vector_base<cfd::js::api::json::DescriptorScriptJson,_std::allocator<cfd::js::api::json::DescriptorScriptJson>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->scripts_).super_JsonVector<cfd::js::api::json::DescriptorScriptJson>.
  super_vector<cfd::js::api::json::DescriptorScriptJson,_std::allocator<cfd::js::api::json::DescriptorScriptJson>_>
  .
  super__Vector_base<cfd::js::api::json::DescriptorScriptJson,_std::allocator<cfd::js::api::json::DescriptorScriptJson>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scripts_).super_JsonVector<cfd::js::api::json::DescriptorScriptJson>.
  super_vector<cfd::js::api::json::DescriptorScriptJson,_std::allocator<cfd::js::api::json::DescriptorScriptJson>_>
  .
  super__Vector_base<cfd::js::api::json::DescriptorScriptJson,_std::allocator<cfd::js::api::json::DescriptorScriptJson>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scripts_).super_JsonVector<cfd::js::api::json::DescriptorScriptJson>._vptr_JsonVector =
       (_func_int **)&PTR__JsonVector_00b380c8;
  CollectFieldName();
  return;
}

Assistant:

ParseDescriptorResponse() {
    CollectFieldName();
  }